

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getIllConditioning
          (Highs *this,HighsIllConditioning *ill_conditioning,bool constraint,HighsInt method,
          double ill_conditioning_bound)

{
  long in_RDI;
  double in_stack_000059b0;
  HighsInt in_stack_000059b8;
  bool in_stack_000059bf;
  HighsIllConditioning *in_stack_000059c0;
  Highs *in_stack_000059c8;
  HighsStatus local_4;
  
  if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Cannot get ill-conditioning without a valid basis\n");
    local_4 = kError;
  }
  else {
    local_4 = computeIllConditioning
                        (in_stack_000059c8,in_stack_000059c0,in_stack_000059bf,in_stack_000059b8,
                         in_stack_000059b0);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getIllConditioning(HighsIllConditioning& ill_conditioning,
                                      const bool constraint,
                                      const HighsInt method,
                                      const double ill_conditioning_bound) {
  if (!basis_.valid) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot get ill-conditioning without a valid basis\n");
    return HighsStatus::kError;
  }
  return computeIllConditioning(ill_conditioning, constraint, method,
                                ill_conditioning_bound);
}